

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O1

int lj_carith_op(lua_State *L,MMS mm)

{
  ushort uVar1;
  CTState *cts;
  CTypeID CVar2;
  CTSize CVar3;
  ulong uVar4;
  CType *pCVar5;
  CType *pCVar6;
  void *pvVar7;
  long lVar8;
  cTValue *tv;
  GCstr *pGVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  MMS mm_00;
  uint uVar13;
  ErrMsg em;
  undefined4 in_register_00000034;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint64_t uVar17;
  TValue TVar18;
  TValue TVar19;
  lua_State *plVar20;
  bool bVar21;
  bool bVar22;
  uint64_t u0;
  CDArith ca;
  ulong local_80;
  ulong local_78 [2];
  lua_State *local_68;
  undefined8 local_60;
  TValue local_58 [2];
  CType *local_48 [2];
  CType *local_38;
  
  local_60 = CONCAT44(in_register_00000034,mm);
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  TVar19 = (TValue)L->base;
  local_68 = L;
  if (L->top <= (TValue *)(TVar19.u64 + 8)) {
    lj_err_argt(L,1,10);
  }
  bVar21 = true;
  lVar8 = 0;
  do {
    uVar15 = *(ulong *)TVar19;
    uVar4 = (long)uVar15 >> 0x2f;
    if (uVar4 == 0xfffffffffffffff5) {
      uVar1 = *(ushort *)((uVar15 & 0x7fffffffffff) + 10);
      pCVar5 = cts->tab;
      TVar18.u64 = (uVar15 & 0x7fffffffffff) + 0x10;
      uVar14 = pCVar5[uVar1].info >> 0x1c;
      if (uVar14 == 6) {
        TVar18.u64 = *TVar18.u64;
        CVar2 = lj_ctype_intern(cts,uVar1 | 0x20030000,8);
        pCVar6 = cts->tab + CVar2;
      }
      else {
        pCVar6 = pCVar5 + uVar1;
        if (uVar14 == 2) {
          if (pCVar6->size == 4) {
            uVar14 = *(uint *)TVar18;
            TVar18.field_4.it = 0;
            TVar18.u64._0_4_ = uVar14;
          }
          else {
            TVar18.u64 = *TVar18.u64;
          }
          if ((pCVar5[uVar1].info & 0xf0800000) == 0x20800000) {
            pCVar6 = pCVar5 + (ushort)pCVar6->info;
          }
        }
      }
      if ((pCVar6->info & 0xf0000000) == 0x50000000) {
        pCVar6 = (CType *)((long)&cts->tab->info + (ulong)((pCVar6->info & 0xffff) * 0x18));
      }
LAB_00147435:
      local_48[lVar8] = pCVar6;
      local_58[lVar8].u64 = (uint64_t)TVar18;
    }
    else {
      if (uVar4 < 0xfffffffffffffff2) {
        pCVar6 = cts->tab + 0xe;
        TVar18 = TVar19;
        goto LAB_00147435;
      }
      if (uVar15 == 0xffffffffffffffff) {
        pCVar6 = cts->tab + 0x11;
        TVar18.u64 = 0;
        goto LAB_00147435;
      }
      if (uVar4 != 0xfffffffffffffffb) {
        pCVar6 = (CType *)0x0;
        TVar18.u64 = 1;
        bVar21 = false;
        goto LAB_00147435;
      }
      uVar1 = *(ushort *)
               ((*(ulong *)((ulong)(lVar8 == 0) * 0x10 + -8 + TVar19.u64) & 0x7fffffffffff) + 10);
      pCVar6 = cts->tab;
      uVar14 = pCVar6[uVar1].info;
      local_48[lVar8] = (CType *)0x0;
      local_58[lVar8].u64 = (uint64_t)((GCstr *)(uVar15 & 0x7fffffffffff) + 1);
      if ((uVar14 & 0xf0000000) == 0x50000000) {
        pCVar6 = pCVar6 + uVar1;
        pCVar5 = lj_ctype_getfieldq(cts,pCVar6,(GCstr *)(uVar15 & 0x7fffffffffff),(CTSize *)local_78
                                    ,(CTInfo *)0x0);
        if ((pCVar5 == (CType *)0x0) || ((pCVar5->info & 0xf0000000) != 0xb0000000)) {
          uVar15 = (ulong)(uint)((1 - (int)lVar8) * 8);
          *(CType **)((long)local_48 + uVar15) = pCVar6;
          *(undefined8 *)((long)local_58 + uVar15) = 0;
          bVar21 = false;
          bVar22 = false;
        }
        else {
          local_48[lVar8] =
               (CType *)((long)&cts->tab->info + (ulong)((pCVar5->info & 0xffff) * 0x18));
          local_58[lVar8].u64 = (uint64_t)&pCVar5->size;
          bVar22 = true;
          bVar21 = true;
        }
      }
      else {
        bVar22 = true;
        bVar21 = false;
      }
      if (!bVar22) break;
    }
    TVar19.u64 = TVar19.u64 + 8;
    bVar22 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar22);
  TVar18 = local_58[1];
  TVar19 = local_58[0];
  mm_00 = (MMS)local_60;
  if (((!bVar21) || (mm_00 == MM_FAST)) || (mm_00 == MM_concat)) goto LAB_001477ea;
  if (((0xfffffff < local_48[0]->info) || (8 < local_48[0]->size)) ||
     ((0xfffffff < local_48[1]->info || (8 < local_48[1]->size)))) {
    uVar14 = local_48[0]->info;
    if ((uVar14 & 0xf0000000) == 0x20000000 || (uVar14 & 0xfc000000) == 0x30000000) {
      if (((mm_00 < MM_mul) && ((0x8d0U >> (mm_00 & (MM_unm|MM_pow)) & 1) != 0)) &&
         ((local_48[1]->info & 0xf0000000) == 0x20000000 ||
          (local_48[1]->info & 0xfc000000) == 0x30000000)) {
        if (mm_00 == MM_eq) {
          bVar21 = local_58[0].u64 != local_58[1].u64;
          goto LAB_00147651;
        }
        iVar12 = lj_cconv_compatptr(cts,local_48[0],local_48[1],8);
        if (iVar12 != 0) {
          if ((int)local_60 != 0xb) {
            if ((int)local_60 == 6) {
              bVar21 = TVar18.u64 <= TVar19.u64;
            }
            else {
              bVar21 = TVar18.u64 < TVar19.u64;
            }
            local_68->top[-1].u64 = ((ulong)bVar21 << 0x2f) + 0xfffeffffffffffff;
            plVar20 = local_68;
            goto LAB_00147b3c;
          }
          CVar3 = lj_ctype_size(cts,(uint)(ushort)local_48[0]->info);
          if (1 < CVar3 + 1) {
            local_68->top[-1].n =
                 (double)(int)((long)(TVar19.u64 - (long)TVar18) / (long)(int)CVar3);
            plVar20 = local_68;
            goto LAB_00147b3c;
          }
        }
      }
      else if (((mm_00 & ~MM_newindex) == MM_add) && (local_48[1]->info < 0x10000000)) {
        lj_cconv_ct_ct(cts,cts->tab + 0xb,local_48[1],(uint8_t *)local_78,(uint8_t *)local_58[1],0);
        TVar18 = TVar19;
        local_48[1] = local_48[0];
        if ((uint)local_60 == 0xb) {
          local_78[0] = -local_78[0];
        }
        goto LAB_00147716;
      }
    }
    else if ((uVar14 < 0x10000000 && mm_00 == MM_add) &&
            ((local_48[1]->info & 0xf0000000) == 0x20000000 ||
             (local_48[1]->info & 0xfc000000) == 0x30000000)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xb,local_48[0],(uint8_t *)local_78,(uint8_t *)local_58[0],0);
LAB_00147716:
      CVar3 = lj_ctype_size(cts,(uint)(ushort)local_48[1]->info);
      if (CVar3 != 0xffffffff) {
        lVar8 = (long)(int)CVar3 * local_78[0];
        CVar2 = lj_ctype_intern(cts,(ushort)local_48[1]->info | 0x20030000,8);
        pvVar7 = lj_mem_newgco(cts->L,0x18);
        *(undefined1 *)((long)pvVar7 + 9) = 10;
        *(short *)((long)pvVar7 + 10) = (short)CVar2;
        *(uint8_t **)((long)pvVar7 + 0x10) = (uint8_t *)(TVar18.u64 + lVar8);
        local_68->top[-1].u64 = (ulong)pvVar7 | 0xfffa800000000000;
        plVar20 = local_68;
        goto switchD_00147598_default;
      }
    }
    mm_00 = (MMS)local_60;
LAB_001477ea:
    plVar20 = local_68;
    uVar17 = 0xffff7fffffffffff;
    if ((local_68->base->u64 & 0xffff800000000000) == 0xfffa800000000000) {
      uVar1 = *(ushort *)((local_68->base->u64 & 0x7fffffffffff) + 10);
      uVar14 = cts->tab[uVar1].info;
      uVar13 = (uint)uVar1;
      if ((uVar14 & 0xf0000000) == 0x20000000) {
        uVar13 = uVar14 & 0xffff;
      }
      tv = lj_ctype_meta(cts,uVar13,mm_00);
    }
    else {
      tv = (cTValue *)0x0;
    }
    if (tv == (cTValue *)0x0) {
      if ((plVar20->base + 1 < plVar20->top) &&
         (uVar15 = plVar20->base[1].u64, (uVar15 & 0xffff800000000000) == 0xfffa800000000000)) {
        uVar1 = *(ushort *)((uVar15 & 0x7fffffffffff) + 10);
        uVar14 = cts->tab[uVar1].info;
        uVar13 = (uint)uVar1;
        if ((uVar14 & 0xf0000000) == 0x20000000) {
          uVar13 = uVar14 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar13,mm_00);
      }
      else {
        tv = (cTValue *)0x0;
      }
    }
    if (tv == (cTValue *)0x0) {
      if (mm_00 == MM_eq) {
        if (local_58[0].u64 == local_58[1].u64) {
          uVar17 = 0xfffeffffffffffff;
        }
        plVar20->top[-1].u64 = uVar17;
        *(uint64_t *)((plVar20->glref).ptr64 + 0xf0) = uVar17;
        return 1;
      }
      uVar15 = 0xffffffff;
      uVar4 = 0;
      uVar14 = 0xffffffff;
      do {
        pCVar6 = local_48[uVar4];
        if ((pCVar6 == (CType *)0x0) ||
           ((local_68->base[uVar4].u64 & 0xffff800000000000) != 0xfffa800000000000)) {
          if ((local_68->base[uVar4].it64 & 0xffff800000000000U) == 0xfffd800000000000) {
            uVar15 = uVar4 & 0xffffffff;
          }
          uVar10 = local_68->base[uVar4].it64 >> 0x2f;
          uVar11 = ~uVar10;
          if (uVar10 < 0xfffffffffffffff3) {
            uVar11 = 0xd;
          }
          pGVar9 = (GCstr *)lj_obj_itypename[uVar11];
        }
        else {
          if ((pCVar6->info & 0xf0000000) == 0x50000000) {
            uVar14 = (uint)uVar4;
          }
          local_38 = (CType *)CONCAT44(local_38._4_4_,uVar14);
          pGVar9 = lj_ctype_repr(local_68,(int)((ulong)((long)pCVar6 - (long)cts->tab) >> 3) *
                                          -0x55555555,(GCstr *)0x0);
          pGVar9 = pGVar9 + 1;
          uVar14 = (uint)local_38;
        }
        local_78[uVar4] = (ulong)pGVar9;
        uVar4 = uVar4 + 1;
      } while (uVar4 == 1);
      if (((uint)uVar15 ^ uVar14) == 1) {
        local_78[1] = local_78[(int)uVar14];
        uVar15 = local_78[(int)(uint)uVar15];
        em = LJ_ERR_FFI_BADCONV;
      }
      else {
        uVar15 = local_78[0];
        if ((uint)local_60 == 5) {
          em = LJ_ERR_FFI_BADLEN;
        }
        else if ((uint)local_60 == 8) {
          em = LJ_ERR_FFI_BADCONCAT;
        }
        else {
          em = LJ_ERR_FFI_BADARITH;
          if ((uint)local_60 < 10) {
            em = LJ_ERR_FFI_BADCOMP;
          }
        }
      }
      lj_err_callerv(local_68,em,uVar15,local_78[1]);
    }
    iVar12 = lj_meta_tailcall(plVar20,tv);
    return iVar12;
  }
  local_38 = local_48[1];
  iVar12 = 0xc;
  if ((((byte)(local_48[0]->info >> 0x17) & local_48[0]->size == 8) == 0) &&
     (iVar12 = 0xb, (local_48[1]->info >> 0x17 & 1) != 0)) {
    iVar12 = (local_48[1]->size == 8) + 0xb;
  }
  pCVar6 = (CType *)((long)&cts->tab->info + (ulong)(uint)(iVar12 * 0x18));
  lj_cconv_ct_ct(cts,pCVar6,local_48[0],(uint8_t *)local_78,(uint8_t *)local_58[0],0);
  plVar20 = local_68;
  iVar16 = (int)local_60;
  if (iVar16 != 0x10) {
    lj_cconv_ct_ct(cts,pCVar6,local_38,(uint8_t *)&local_80,(uint8_t *)local_58[1],0);
    if (iVar16 == 7) {
      bVar21 = local_78[0] <= local_80;
      bVar22 = (long)local_78[0] <= (long)local_80;
    }
    else {
      if (iVar16 != 6) {
        if (iVar16 == 4) {
          plVar20->top[-1].u64 = ((ulong)(local_78[0] != local_80) << 0x2f) + 0xfffeffffffffffff;
          goto LAB_00147b3c;
        }
        goto LAB_0014754e;
      }
      bVar21 = local_78[0] < local_80;
      bVar22 = (long)local_78[0] < (long)local_80;
    }
    if (iVar12 == 0xb) {
      bVar21 = bVar22;
    }
    bVar21 = (bool)(bVar21 ^ 1);
    local_68 = plVar20;
LAB_00147651:
    local_68->top[-1].u64 = ((ulong)bVar21 << 0x2f) + 0xfffeffffffffffff;
    plVar20 = local_68;
    goto LAB_00147b3c;
  }
LAB_0014754e:
  pvVar7 = lj_mem_newgco(cts->L,0x18);
  *(undefined1 *)((long)pvVar7 + 9) = 10;
  *(short *)((long)pvVar7 + 10) = (short)iVar12;
  plVar20->top[-1].u64 = (ulong)pvVar7 | 0xfffa800000000000;
  switch(iVar16) {
  case 10:
    uVar15 = local_80 + local_78[0];
    break;
  case 0xb:
    uVar15 = local_78[0] - local_80;
    break;
  case 0xc:
    uVar15 = local_80 * local_78[0];
    break;
  case 0xd:
    if (iVar12 == 0xb) {
      uVar15 = 0x8000000000000000;
      if ((local_80 != 0) && (local_80 != 0xffffffffffffffff || local_78[0] != 0x8000000000000000))
      {
        uVar15 = (long)local_78[0] / (long)local_80;
      }
    }
    else if (local_80 == 0) {
      uVar15 = 0x8000000000000000;
    }
    else {
      uVar15 = local_78[0] / local_80;
    }
    break;
  case 0xe:
    uVar15 = 0x8000000000000000;
    if (iVar12 == 0xb) {
      if (local_80 != 0) {
        if (local_80 == 0xffffffffffffffff && local_78[0] == 0x8000000000000000) {
          uVar15 = 0;
        }
        else {
          uVar15 = (long)local_78[0] % (long)local_80;
        }
      }
    }
    else if (local_80 != 0) {
      uVar15 = local_78[0] % local_80;
    }
    break;
  case 0xf:
    if (iVar12 == 0xb) {
      uVar15 = lj_carith_powi64(local_78[0],local_80);
    }
    else {
      uVar15 = lj_carith_powu64(local_78[0],local_80);
    }
    break;
  case 0x10:
    uVar15 = -local_78[0];
    break;
  default:
    goto switchD_00147598_default;
  }
  *(ulong *)((long)pvVar7 + 0x10) = uVar15;
switchD_00147598_default:
  uVar17 = (plVar20->glref).ptr64;
  if (*(ulong *)(uVar17 + 0x18) <= *(ulong *)(uVar17 + 0x10)) {
    lj_gc_step(plVar20);
  }
LAB_00147b3c:
  *(TValue *)((plVar20->glref).ptr64 + 0xf0) = plVar20->top[-1];
  return 1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}